

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

Instruction ** __thiscall
Hpipe::Vec<Hpipe::Instruction*>::push_back<Hpipe::Instruction*&>
          (Vec<Hpipe::Instruction*> *this,Instruction **args)

{
  reference ppIVar1;
  Instruction **args_local;
  Vec<Hpipe::Instruction_*> *this_local;
  
  std::vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>>::
  emplace_back<Hpipe::Instruction*&>
            ((vector<Hpipe::Instruction*,std::allocator<Hpipe::Instruction*>> *)this,args);
  ppIVar1 = std::vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>::back
                      ((vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_> *)this);
  return ppIVar1;
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }